

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

int * PeerArray(int MySize,int MyRank,int PeerSize)

{
  int *piVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int i;
  int *MyPeers;
  int Start;
  int StartOffset;
  int Leftovers;
  int PortionSize;
  int local_2c;
  int local_18;
  int local_10;
  
  local_10 = in_EDX / in_EDI;
  local_18 = in_EDX - local_10 * in_EDI;
  if (in_ESI < local_18) {
    local_10 = local_10 + 1;
    local_18 = 0;
  }
  piVar1 = (int *)malloc((long)(local_10 + 1) << 2);
  for (local_2c = 0; local_2c < local_10; local_2c = local_2c + 1) {
    piVar1[local_2c] = local_10 * in_ESI + local_18 + local_2c;
  }
  piVar1[local_10] = -1;
  return piVar1;
}

Assistant:

static int *PeerArray(int MySize, int MyRank, int PeerSize)
{
    int PortionSize = PeerSize / MySize;
    int Leftovers = PeerSize - PortionSize * MySize;
    int StartOffset = Leftovers;
    int Start;
    if (MyRank < Leftovers)
    {
        PortionSize++;
        StartOffset = 0;
    }
    Start = PortionSize * MyRank + StartOffset;
    int *MyPeers = malloc((PortionSize + 1) * sizeof(int));
    for (int i = 0; i < PortionSize; i++)
    {
        MyPeers[i] = Start + i;
    }
    MyPeers[PortionSize] = -1;

    return MyPeers;
}